

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall LongReadsMapper::write_read_paths(LongReadsMapper *this,string *filename)

{
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(string *)filename,_S_bin);
  sdglib::write_flat_vectorvector<long>(&ofs,&this->read_paths);
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void LongReadsMapper::write_read_paths(std::string filename) {
    std::ofstream ofs(filename, std::ios_base::binary);
    sdglib::write_flat_vectorvector(ofs, read_paths);
}